

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O0

void __thiscall AnalyzerDecl::~AnalyzerDecl(AnalyzerDecl *this)

{
  Function *pFVar1;
  Param *pPVar2;
  bool bVar3;
  reference ppSVar4;
  reference ppAVar5;
  reference ppFVar6;
  reference ppPVar7;
  reference ppAVar8;
  undefined8 *in_RDI;
  iterator delete_list_i_7;
  iterator delete_list_i_6;
  iterator delete_list_i_5;
  iterator delete_list_i_4;
  iterator delete_list_i_3;
  iterator delete_list_i_2;
  iterator delete_list_i_1;
  iterator delete_list_i;
  vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_> *in_stack_fffffffffffffee8;
  Param *in_stack_fffffffffffffef0;
  void *pvVar9;
  vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_> *in_stack_ffffffffffffff00;
  vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *this_00;
  TypeDecl *this_01;
  Function *in_stack_ffffffffffffff30;
  __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
  local_80;
  AnalyzerHelper **local_78;
  __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
  local_70;
  AnalyzerHelper **local_68;
  __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
  local_60;
  Param **local_58;
  __normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_> local_50;
  Function **local_48;
  __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_> local_40;
  AnalyzerHelper **local_38;
  __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
  local_30;
  AnalyzerAction **local_28;
  __normal_iterator<AnalyzerAction_**,_std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>_>
  local_20;
  StateVar **local_18;
  __normal_iterator<StateVar_**,_std::vector<StateVar_*,_std::allocator<StateVar_*>_>_> local_10 [2]
  ;
  
  *in_RDI = &PTR__AnalyzerDecl_00178f98;
  if (in_RDI[0x11] != 0) {
    local_10[0]._M_current =
         (StateVar **)
         std::vector<StateVar_*,_std::allocator<StateVar_*>_>::begin
                   ((vector<StateVar_*,_std::allocator<StateVar_*>_> *)in_stack_fffffffffffffee8);
    while( true ) {
      local_18 = (StateVar **)
                 std::vector<StateVar_*,_std::allocator<StateVar_*>_>::end
                           ((vector<StateVar_*,_std::allocator<StateVar_*>_> *)
                            in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<StateVar_**,_std::vector<StateVar_*,_std::allocator<StateVar_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<StateVar_**,_std::vector<StateVar_*,_std::allocator<StateVar_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppSVar4 = __gnu_cxx::
                __normal_iterator<StateVar_**,_std::vector<StateVar_*,_std::allocator<StateVar_*>_>_>
                ::operator*(local_10);
      if (*ppSVar4 != (StateVar *)0x0) {
        operator_delete(*ppSVar4,0x10);
      }
      __gnu_cxx::
      __normal_iterator<StateVar_**,_std::vector<StateVar_*,_std::allocator<StateVar_*>_>_>::
      operator++(local_10);
    }
  }
  pvVar9 = (void *)in_RDI[0x11];
  if (pvVar9 != (void *)0x0) {
    std::vector<StateVar_*,_std::allocator<StateVar_*>_>::~vector
              ((vector<StateVar_*,_std::allocator<StateVar_*>_> *)in_stack_ffffffffffffff00);
    operator_delete(pvVar9,0x18);
  }
  in_RDI[0x11] = 0;
  if (in_RDI[0x12] != 0) {
    local_20._M_current =
         (AnalyzerAction **)
         std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>::begin
                   (in_stack_fffffffffffffee8);
    while( true ) {
      local_28 = (AnalyzerAction **)
                 std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>::end
                           (in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<AnalyzerAction_**,_std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<AnalyzerAction_**,_std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppAVar5 = __gnu_cxx::
                __normal_iterator<AnalyzerAction_**,_std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>_>
                ::operator*(&local_20);
      if (*ppAVar5 != (AnalyzerAction *)0x0) {
        (*((*ppAVar5)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
      __gnu_cxx::
      __normal_iterator<AnalyzerAction_**,_std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>_>
      ::operator++(&local_20);
    }
  }
  pvVar9 = (void *)in_RDI[0x12];
  if (pvVar9 != (void *)0x0) {
    std::vector<AnalyzerAction_*,_std::allocator<AnalyzerAction_*>_>::~vector
              (in_stack_ffffffffffffff00);
    operator_delete(pvVar9,0x18);
  }
  in_RDI[0x12] = 0;
  if (in_RDI[0x13] != 0) {
    local_30._M_current =
         (AnalyzerHelper **)
         std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::begin
                   ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    in_stack_fffffffffffffee8);
    while( true ) {
      local_38 = (AnalyzerHelper **)
                 std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::end
                           ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                            in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppAVar8 = __gnu_cxx::
                __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                ::operator*(&local_30);
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
      __gnu_cxx::
      __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
      ::operator++(&local_30);
    }
  }
  pvVar9 = (void *)in_RDI[0x13];
  if (pvVar9 != (void *)0x0) {
    std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~vector
              ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
               in_stack_ffffffffffffff00);
    operator_delete(pvVar9,0x18);
  }
  in_RDI[0x13] = 0;
  if (in_RDI[0x14] != 0) {
    local_40._M_current =
         (Function **)
         std::vector<Function_*,_std::allocator<Function_*>_>::begin
                   ((vector<Function_*,_std::allocator<Function_*>_> *)in_stack_fffffffffffffee8);
    while( true ) {
      local_48 = (Function **)
                 std::vector<Function_*,_std::allocator<Function_*>_>::end
                           ((vector<Function_*,_std::allocator<Function_*>_> *)
                            in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppFVar6 = __gnu_cxx::
                __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                ::operator*(&local_40);
      pFVar1 = *ppFVar6;
      if (pFVar1 != (Function *)0x0) {
        Function::~Function(in_stack_ffffffffffffff30);
        operator_delete(pFVar1,0x80);
      }
      __gnu_cxx::
      __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>::
      operator++(&local_40);
    }
  }
  pvVar9 = (void *)in_RDI[0x14];
  if (pvVar9 != (void *)0x0) {
    std::vector<Function_*,_std::allocator<Function_*>_>::~vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)in_stack_ffffffffffffff00);
    operator_delete(pvVar9,0x18);
  }
  in_RDI[0x14] = 0;
  if (in_RDI[0xf] != 0) {
    local_50._M_current =
         (Param **)
         std::vector<Param_*,_std::allocator<Param_*>_>::begin
                   ((vector<Param_*,_std::allocator<Param_*>_> *)in_stack_fffffffffffffee8);
    while( true ) {
      local_58 = (Param **)
                 std::vector<Param_*,_std::allocator<Param_*>_>::end
                           ((vector<Param_*,_std::allocator<Param_*>_> *)in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppPVar7 = __gnu_cxx::
                __normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>::
                operator*(&local_50);
      pPVar2 = *ppPVar7;
      if (pPVar2 != (Param *)0x0) {
        Param::~Param(in_stack_fffffffffffffef0);
        operator_delete(pPVar2,0x80);
      }
      __gnu_cxx::__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>::
      operator++(&local_50);
    }
  }
  this_01 = (TypeDecl *)in_RDI[0xf];
  if (this_01 != (TypeDecl *)0x0) {
    std::vector<Param_*,_std::allocator<Param_*>_>::~vector
              ((vector<Param_*,_std::allocator<Param_*>_> *)in_stack_ffffffffffffff00);
    operator_delete(this_01,0x18);
  }
  in_RDI[0xf] = 0;
  if (in_RDI[0x15] != 0) {
    local_60._M_current =
         (AnalyzerHelper **)
         std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::begin
                   ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    in_stack_fffffffffffffee8);
    while( true ) {
      local_68 = (AnalyzerHelper **)
                 std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::end
                           ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                            in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppAVar8 = __gnu_cxx::
                __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                ::operator*(&local_60);
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
      __gnu_cxx::
      __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
      ::operator++(&local_60);
    }
  }
  pvVar9 = (void *)in_RDI[0x15];
  if (pvVar9 != (void *)0x0) {
    std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~vector
              ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
               in_stack_ffffffffffffff00);
    operator_delete(pvVar9,0x18);
  }
  in_RDI[0x15] = 0;
  if (in_RDI[0x16] != 0) {
    local_70._M_current =
         (AnalyzerHelper **)
         std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::begin
                   ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    in_stack_fffffffffffffee8);
    while( true ) {
      local_78 = (AnalyzerHelper **)
                 std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::end
                           ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                            in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppAVar8 = __gnu_cxx::
                __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                ::operator*(&local_70);
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
      __gnu_cxx::
      __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
      ::operator++(&local_70);
    }
  }
  this_00 = (vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)in_RDI[0x16];
  if (this_00 != (vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)0x0) {
    std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~vector(this_00);
    operator_delete(this_00,0x18);
  }
  in_RDI[0x16] = 0;
  if (in_RDI[0x17] != 0) {
    local_80._M_current =
         (AnalyzerHelper **)
         std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::begin
                   ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                    in_stack_fffffffffffffee8);
    while( true ) {
      std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::end
                ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)
                 in_stack_fffffffffffffee8);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar3) break;
      ppAVar8 = __gnu_cxx::
                __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                ::operator*(&local_80);
      if (*ppAVar8 != (AnalyzerHelper *)0x0) {
        (*((*ppAVar8)->super_AnalyzerElement)._vptr_AnalyzerElement[1])();
      }
      __gnu_cxx::
      __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
      ::operator++(&local_80);
    }
  }
  pvVar9 = (void *)in_RDI[0x17];
  if (pvVar9 != (void *)0x0) {
    std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::~vector(this_00);
    operator_delete(pvVar9,0x18);
  }
  in_RDI[0x17] = 0;
  TypeDecl::~TypeDecl(this_01);
  return;
}

Assistant:

AnalyzerDecl::~AnalyzerDecl()
	{
	delete_list(StateVarList, statevars_);
	delete_list(AnalyzerActionList, actions_);
	delete_list(AnalyzerHelperList, helpers_);
	delete_list(FunctionList, functions_);
	delete_list(ParamList, params_);
	delete_list(AnalyzerHelperList, constructor_helpers_);
	delete_list(AnalyzerHelperList, destructor_helpers_);
	delete_list(AnalyzerHelperList, eof_helpers_);
	}